

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

bool __thiscall CConnman::DisconnectNode(CConnman *this,NodeId id)

{
  long lVar1;
  string_view source_file;
  string_view logging_function;
  bool bVar2;
  iterator iVar3;
  iterator iVar4;
  reference ppCVar5;
  NodeId NVar6;
  long in_RSI;
  long in_FS_OFFSET;
  CNode *pnode;
  vector<CNode_*,_std::allocator<CNode_*>_> *__range1;
  iterator __end1;
  iterator __begin1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock95;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  vector<CNode_*,_std::allocator<CNode_*>_> *in_stack_ffffffffffffff20;
  __normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
  *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  char *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff50;
  long lVar7;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_ffffffffffffff58;
  LogFlags in_stack_ffffffffffffff80;
  int source_line;
  bool local_51;
  ConstevalFormatString<1U> in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
             (char *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
             in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
             SUB41((uint)in_stack_ffffffffffffff38 >> 0x18,0));
  iVar3 = std::vector<CNode_*,_std::allocator<CNode_*>_>::begin(in_stack_ffffffffffffff20);
  iVar4 = std::vector<CNode_*,_std::allocator<CNode_*>_>::end(in_stack_ffffffffffffff20);
  do {
    bVar2 = __gnu_cxx::operator==<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                      (in_stack_ffffffffffffff28,
                       (__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                        *)in_stack_ffffffffffffff20);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_51 = false;
LAB_01012cb3:
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return local_51;
    }
    ppCVar5 = __gnu_cxx::
              __normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>::
              operator*((__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                         *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    source_line = (int)((ulong)*ppCVar5 >> 0x20);
    lVar7 = in_RSI;
    NVar6 = CNode::GetId((CNode *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    if (lVar7 == NVar6) {
      bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                                  Trace);
      if (bVar2) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                   in_stack_ffffffffffffff30);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                   in_stack_ffffffffffffff30);
        CNode::GetId((CNode *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        in_stack_ffffffffffffff18 = 1;
        logging_function._M_str = in_stack_ffffffffffffffe8;
        logging_function._M_len = (size_t)iVar3._M_current;
        source_file._M_str = (char *)iVar4._M_current;
        source_file._M_len = in_stack_ffffffffffffffd0;
        LogPrintFormatInternal<long>
                  (logging_function,source_file,source_line,in_stack_ffffffffffffff80,
                   (Level)__end1._M_current,in_stack_ffffffffffffffc8,
                   (long *)criticalblock95.super_unique_lock._M_device);
      }
      std::atomic<bool>::operator=
                ((atomic<bool> *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),false
                );
      local_51 = true;
      goto LAB_01012cb3;
    }
    __gnu_cxx::__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>::
    operator++((__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_> *)
               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  } while( true );
}

Assistant:

bool CConnman::DisconnectNode(NodeId id)
{
    LOCK(m_nodes_mutex);
    for(CNode* pnode : m_nodes) {
        if (id == pnode->GetId()) {
            LogDebug(BCLog::NET, "disconnect by id peer=%d; disconnecting\n", pnode->GetId());
            pnode->fDisconnect = true;
            return true;
        }
    }
    return false;
}